

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ppmd7.c
# Opt level: O2

void SplitBlock(CPpmd7 *p,void *ptr,uint oldIndx,uint newIndx)

{
  byte bVar1;
  CPpmd_Void_Ref *pCVar2;
  ulong uVar3;
  uint uVar4;
  int iVar5;
  
  uVar4 = (uint)p->Indx2Units[oldIndx] - (uint)p->Indx2Units[newIndx];
  pCVar2 = (CPpmd_Void_Ref *)((ulong)p->Indx2Units[newIndx] * 0xc + (long)ptr);
  uVar3 = (ulong)p->Units2Indx[uVar4 - 1];
  if (uVar4 == p->Indx2Units[uVar3]) {
    iVar5 = (int)p->Base;
  }
  else {
    uVar3 = (ulong)(p->Units2Indx[uVar4 - 1] - 1);
    bVar1 = p->Indx2Units[uVar3];
    pCVar2[(ulong)bVar1 * 3] = p->FreeList[uVar4 + ~(uint)bVar1];
    iVar5 = (int)p->Base;
    p->FreeList[uVar4 + ~(uint)bVar1] = ((int)pCVar2 + (uint)bVar1 * 0xc) - iVar5;
  }
  *pCVar2 = p->FreeList[uVar3];
  p->FreeList[uVar3] = (int)pCVar2 - iVar5;
  return;
}

Assistant:

static void SplitBlock(CPpmd7 *p, void *ptr, unsigned oldIndx, unsigned newIndx)
{
  unsigned i, nu = I2U(oldIndx) - I2U(newIndx);
  ptr = (Byte *)ptr + U2B(I2U(newIndx));
  if (I2U(i = U2I(nu)) != nu)
  {
    unsigned k = I2U(--i);
    InsertNode(p, ((Byte *)ptr) + U2B(k), nu - k - 1);
  }
  InsertNode(p, ptr, i);
}